

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O0

size_t Q_GetPos(QMatrix *Q,size_t RoC,size_t Entry)

{
  LASErrIdType LVar1;
  size_t local_28;
  size_t Pos;
  size_t Entry_local;
  size_t RoC_local;
  QMatrix *Q_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if (((RoC == 0) || (Q->Dim < RoC)) || (Q->Len[RoC] <= Entry)) {
      LASError(LASRangeErr,"Q_GetPos",Q->Name,(char *)0x0,(char *)0x0);
      local_28 = 0;
    }
    else {
      local_28 = Q->El[RoC][Entry].Pos;
    }
  }
  else {
    local_28 = 0;
  }
  return local_28;
}

Assistant:

size_t Q_GetPos(QMatrix *Q, size_t RoC, size_t Entry)
/* returns the position of a matrix element */
{
    size_t Pos;

    if (LASResult() == LASOK)
        if (RoC > 0 && RoC <= Q->Dim && Entry < Q->Len[RoC]) {
            Pos = Q->El[RoC][Entry].Pos;
        } else {
            LASError(LASRangeErr, "Q_GetPos", Q->Name, NULL, NULL);
            Pos = 0;
        }
    else
        Pos = 0;
    return(Pos);
}